

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O0

Rwt_Man_t * Rwt_ManStart(int fPrecompute)

{
  abctime aVar1;
  Rwt_Man_t *p_00;
  char *pcVar2;
  Rwt_Node_t **ppRVar3;
  Mem_Fixed_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  char **ppcVar6;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  abctime clk;
  Rwt_Man_t *p;
  int fPrecompute_local;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  p_00 = (Rwt_Man_t *)malloc(0x480);
  memset(p_00,0,0x480);
  p_00->nFuncs = 0x10000;
  Rwt_ManGlobalStart();
  p_00->puCanons = s_puCanons;
  p_00->pPhases = s_pPhases;
  p_00->pPerms = s_pPerms;
  p_00->pMap = s_pMap;
  pcVar2 = Rwt_ManGetPractical(p_00);
  p_00->pPractical = pcVar2;
  ppRVar3 = (Rwt_Node_t **)malloc((long)p_00->nFuncs << 3);
  p_00->pTable = ppRVar3;
  memset(p_00->pTable,0,(long)p_00->nFuncs << 3);
  pMVar4 = Mem_FixedStart(0x28);
  p_00->pMmNode = pMVar4;
  pVVar5 = Vec_PtrAlloc(100);
  p_00->vForest = pVVar5;
  Rwt_ManAddVar(p_00,0,fPrecompute);
  Rwt_ManAddVar(p_00,0xaaaa,fPrecompute);
  Rwt_ManAddVar(p_00,0xcccc,fPrecompute);
  Rwt_ManAddVar(p_00,0xf0f0,fPrecompute);
  Rwt_ManAddVar(p_00,0xff00,fPrecompute);
  p_00->nClasses = 5;
  p_00->nTravIds = 1;
  ppcVar6 = Extra_Permutations(4);
  p_00->pPerms4 = ppcVar6;
  pVVar7 = Vec_IntAlloc(0x32);
  p_00->vLevNums = pVVar7;
  pVVar5 = Vec_PtrAlloc(0x32);
  p_00->vFanins = pVVar5;
  pVVar5 = Vec_PtrAlloc(0x32);
  p_00->vFaninsCur = pVVar5;
  pVVar5 = Vec_PtrAlloc(0x32);
  p_00->vNodesTemp = pVVar5;
  if (fPrecompute == 0) {
    Rwt_ManLoadFromArray(p_00,0);
    Rwt_ManPreprocess(p_00);
  }
  aVar8 = Abc_Clock();
  p_00->timeStart = aVar8 - aVar1;
  return p_00;
}

Assistant:

Rwt_Man_t * Rwt_ManStart( int fPrecompute )
{
    Rwt_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwt_Man_t, 1 );
    memset( p, 0, sizeof(Rwt_Man_t) );
    p->nFuncs = (1<<16);
    // copy the global tables
    Rwt_ManGlobalStart();
    p->puCanons = s_puCanons; 
    p->pPhases  = s_pPhases; 
    p->pPerms   = s_pPerms; 
    p->pMap     = s_pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwt_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwt_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwt_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Mem_FixedStart( sizeof(Rwt_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwt_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwt_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwt_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwt_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwt_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
//        Rwt_ManPrecompute( p );
//        Rwt_ManPrint( p );
//        Rwt_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwt_ManLoadFromArray( p, 0 );
//        Rwt_ManPrint( p );
        Rwt_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}